

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_crypto.c
# Opt level: O0

_Bool i2p_dest_load(i2p_dest *dest,uint8_t *data,size_t sz)

{
  uint16_t uVar1;
  size_t in_RDX;
  void *in_RSI;
  void *in_RDI;
  uint8_t *ptr;
  
  memcpy(in_RDI,in_RSI,in_RDX);
  *(size_t *)((long)in_RDI + 0x200) = in_RDX;
  *(void **)((long)in_RDI + 0x210) = in_RDI;
  if (*(char *)((long)in_RDI + 0x180) == '\x05') {
    *(undefined1 *)((long)in_RDI + 0x220) = 5;
    uVar1 = bufbe16toh((void *)0x107a8f);
    *(uint16_t *)((long)in_RDI + 0x222) = uVar1;
    uVar1 = bufbe16toh((void *)0x107ab3);
    *(uint16_t *)((long)in_RDI + 0x208) = uVar1;
    uVar1 = bufbe16toh((void *)0x107ad7);
    *(uint16_t *)((long)in_RDI + 0x20a) = uVar1;
    if (*(short *)((long)in_RDI + 0x208) == 7) {
      *(long *)((long)in_RDI + 0x218) = (long)in_RDI + 0x160;
      return true;
    }
  }
  else if (*(char *)((long)in_RDI + 0x180) == '\0') {
    *(undefined2 *)((long)in_RDI + 0x208) = 0;
    *(undefined2 *)((long)in_RDI + 0x20a) = 0;
    *(long *)((long)in_RDI + 0x218) = (long)in_RDI + 0x100;
    *(undefined1 *)((long)in_RDI + 0x220) = 0;
    *(undefined2 *)((long)in_RDI + 0x222) = 0;
    *(undefined8 *)((long)in_RDI + 0x228) = 0;
    return true;
  }
  return false;
}

Assistant:

bool i2p_dest_load(struct i2p_dest * dest, uint8_t * data, size_t sz)
{
  uint8_t * ptr = dest->buf;
  memcpy(ptr, data, sz);
  dest->sz = sz;
  dest->enckey = ptr;
  ptr += 256 + 128;
  if(*ptr == CERT_KEYCERT)
  {
    dest->cert.type = CERT_KEYCERT;
    ptr ++;
    dest->cert.sz = bufbe16toh(ptr);
    ptr += 2;
    dest->sigtype = bufbe16toh(ptr);
    ptr += 2;
    dest->enctype = bufbe16toh(ptr);
    if(dest->sigtype == EDDSA_KEYTYPE)
    {
      dest->sigkey = dest->buf + 256 + EDDSA_PADDING_BYTES;
      return true;
    }
  }
  else if(*ptr == CERT_NULL)
  {
    dest->sigtype = DSA_KEYTYPE;
    dest->enctype = ELG_KEYTYPE;
    dest->sigkey = dest->buf + 256;
    dest->cert.type = CERT_NULL;
    dest->cert.sz = 0;
    dest->cert.data = 0;
    return true;
  }
  return false;
}